

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
getMessageUniquePtr(HelicsMessage message,HelicsError *err)

{
  Message *pMVar1;
  HelicsError *in_RDX;
  
  pMVar1 = getMessageObj(err,in_RDX);
  if (pMVar1 != (Message *)0x0) {
    if (pMVar1->backReference != (void *)0x0) {
      helics::MessageHolder::extractMessage((MessageHolder *)message,(int)pMVar1->backReference);
      if (in_RDX == (HelicsError *)0x0) {
        return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               message;
      }
      if (*message != 0) {
        return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               message;
      }
      in_RDX->error_code = -4;
      in_RDX->message = "the message is NULL";
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             message;
    }
    if (in_RDX != (HelicsError *)0x0) {
      in_RDX->error_code = -4;
      in_RDX->message = "the message is NULL";
    }
  }
  *(undefined8 *)message = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)message
  ;
}

Assistant:

std::unique_ptr<helics::Message> getMessageUniquePtr(HelicsMessage message, HelicsError* err)
{
    static constexpr char invalidLocationString[] = "the message is NULL";
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return nullptr;
    }
    auto* messages = reinterpret_cast<helics::MessageHolder*>(mess->backReference);
    if (messages != nullptr) {
        auto ptr = messages->extractMessage(mess->counter);
        if (!ptr) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidLocationString);
        }
        return ptr;
    }
    assignError(err, HELICS_ERROR_INVALID_ARGUMENT, emptyMessageErrorString);
    return nullptr;
}